

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O0

Box * trigBox(Box *__return_storage_ptr__,int t,Mesh *m)

{
  float fVar1;
  vector<Triangle,_std::allocator<Triangle>_> *this;
  const_reference pvVar2;
  Vector3f *pVVar3;
  float *pfVar4;
  int local_30;
  int local_2c;
  int dim;
  int ii;
  vector<Triangle,_std::allocator<Triangle>_> *tri;
  Mesh *m_local;
  int t_local;
  Box *b;
  
  this = Mesh::getTriangles(m);
  Box::Box(__return_storage_ptr__);
  pvVar2 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this,(long)t);
  pVVar3 = Triangle::getVertex(pvVar2,0);
  Vector3f::operator=(&__return_storage_ptr__->mn,pVVar3);
  pvVar2 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this,(long)t);
  pVVar3 = Triangle::getVertex(pvVar2,0);
  Vector3f::operator=(&__return_storage_ptr__->mx,pVVar3);
  for (local_2c = 1; local_2c < 3; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pfVar4 = Vector3f::operator[](&__return_storage_ptr__->mn,local_30);
      fVar1 = *pfVar4;
      pvVar2 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this,(long)t);
      pVVar3 = Triangle::getVertex(pvVar2,local_2c);
      pfVar4 = Vector3f::operator[](pVVar3,local_30);
      if (*pfVar4 <= fVar1 && fVar1 != *pfVar4) {
        pvVar2 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this,(long)t);
        pVVar3 = Triangle::getVertex(pvVar2,local_2c);
        pfVar4 = Vector3f::operator[](pVVar3,local_30);
        fVar1 = *pfVar4;
        pfVar4 = Vector3f::operator[](&__return_storage_ptr__->mn,local_30);
        *pfVar4 = fVar1;
      }
      pfVar4 = Vector3f::operator[](&__return_storage_ptr__->mx,local_30);
      fVar1 = *pfVar4;
      pvVar2 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this,(long)t);
      pVVar3 = Triangle::getVertex(pvVar2,local_2c);
      pfVar4 = Vector3f::operator[](pVVar3,local_30);
      if (fVar1 < *pfVar4) {
        pvVar2 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this,(long)t);
        pVVar3 = Triangle::getVertex(pvVar2,local_2c);
        pfVar4 = Vector3f::operator[](pVVar3,local_30);
        fVar1 = *pfVar4;
        pfVar4 = Vector3f::operator[](&__return_storage_ptr__->mx,local_30);
        *pfVar4 = fVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box
trigBox(int t, const Mesh &m) {
    const auto &tri = m.getTriangles();

    Box b;
    b.mn = tri[t].getVertex(0);
    b.mx = tri[t].getVertex(0);

    for (int ii = 1; ii < 3; ii++) {
        for (int dim = 0; dim < 3; dim++) {
            if (b.mn[dim] > tri[t].getVertex(ii)[dim]) {
                b.mn[dim] = tri[t].getVertex(ii)[dim];
            }
            if (b.mx[dim] < tri[t].getVertex(ii)[dim]) {
                b.mx[dim] = tri[t].getVertex(ii)[dim];
            }
        }
    }
    return b;
}